

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disasmtool.c
# Opt level: O1

char * exception_type_to_string(ND_EX_TYPE ExType)

{
  char *pcVar1;
  
  if (ExType - ND_EXT_1 < 0x4b) {
    pcVar1 = &DAT_0016888c + *(int *)(&DAT_0016888c + (ulong)(ExType - ND_EXT_1) * 4);
  }
  else {
    pcVar1 = "None";
  }
  return pcVar1;
}

Assistant:

const char*
exception_type_to_string(
    _In_ ND_EX_TYPE ExType
    )
{
    switch (ExType)
    {
    case ND_EXT_1: return "1";
    case ND_EXT_2: return "2";
    case ND_EXT_3: return "3";
    case ND_EXT_4: return "4";
    case ND_EXT_5: return "5";
    case ND_EXT_6: return "6";
    case ND_EXT_7: return "7";
    case ND_EXT_8: return "8";
    case ND_EXT_9: return "9";
    case ND_EXT_10: return "10";
    case ND_EXT_11: return "11";
    case ND_EXT_12: return "12";
    case ND_EXT_13: return "13";
    case ND_EXT_14: return "14";

    case ND_EXT_K20: return "K20";
    case ND_EXT_K21: return "K21";

    case ND_EXT_E1: return "E1";
    case ND_EXT_E1NF: return "E1NF";
    case ND_EXT_E2: return "E2";
    case ND_EXT_E3: return "E3";
    case ND_EXT_E3NF: return "E3NF";
    case ND_EXT_E4: return "E4";
    case ND_EXT_E4nb: return "E4.nb";
    case ND_EXT_E4NF: return "E4NF";
    case ND_EXT_E4NFnb: return "E4NF.nb";
    case ND_EXT_E5: return "E5";
    case ND_EXT_E5NF: return "E5NF";
    case ND_EXT_E6: return "E6";
    case ND_EXT_E6NF: return "E6NF";
    case ND_EXT_E7NM: return "E7NM";
    case ND_EXT_E9: return "E9";
    case ND_EXT_E9NF: return "E9NF";
    case ND_EXT_E10: return "E10";
    case ND_EXT_E10NF: return "E10NF";
    case ND_EXT_E11: return "E11";
    case ND_EXT_E12: return "E12";
    case ND_EXT_E12NP: return "E12NP";

    case ND_EXT_AMX_E1: return "AMX-E1";
    case ND_EXT_AMX_E2: return "AMX-E2";
    case ND_EXT_AMX_E3: return "AMX-E3";
    case ND_EXT_AMX_E4: return "AMX-E4";
    case ND_EXT_AMX_E5: return "AMX-E5";
    case ND_EXT_AMX_E6: return "AMX-E6";
    case ND_EXT_AMX_E7: return "AMX-E7";
    case ND_EXT_AMX_E8: return "AMX-E8";
    case ND_EXT_AMX_E9: return "AMX-E9";
    case ND_EXT_AMX_E10: return "AMX-E10";
    case ND_EXT_AMX_E11: return "AMX-E11";

    case ND_EXT_AMX_EVEX_E1: return "AMX-EVEX-E1";
    case ND_EXT_AMX_EVEX_E2: return "AMX-EVEX-E2";
    case ND_EXT_AMX_EVEX_E3: return "AMX-EVEX-E3";
    case ND_EXT_AMX_EVEX_E4: return "AMX-EVEX-E4";
    case ND_EXT_AMX_EVEX_E5: return "AMX-EVEX-E5";
    case ND_EXT_AMX_EVEX_E6: return "AMX-EVEX-E6";
    case ND_EXT_AMX_EVEX_E7: return "AMX-EVEX-E7";
    case ND_EXT_AMX_EVEX_E8: return "AMX-EVEX-E8";

    case ND_EXT_APX_EVEX_BMI: return "APX-EVEX-BMI";
    case ND_EXT_APX_EVEX_CCMP: return "APX-EVEX-CCMP";
    case ND_EXT_APX_EVEX_WRSS: return "APX-EVEX-WRSS";
    case ND_EXT_APX_EVEX_WRUSS: return "APX-EVEX-WRUSS";
    case ND_EXT_APX_EVEX_CFCMOV: return "APX-EVEX-CFCMOV";
    case ND_EXT_APX_EVEX_CMPCCXADD: return "APX-EVEX-CMPCCXADD";
    case ND_EXT_APX_EVEX_ENQCMD: return "APX-EVEX-ENQCMD";
    case ND_EXT_APX_EVEX_INT: return "APX-EVEX-INT";
    case ND_EXT_APX_EVEX_INVEPT: return "APX-EVEX-INVEPT";
    case ND_EXT_APX_EVEX_INVPCID: return "APX-EVEX-INVPCID";
    case ND_EXT_APX_EVEX_INVVPID: return "APX-EVEX-INVVPID";
    case ND_EXT_APX_EVEX_KEYLOCKER: return "APX-EVEX-KEYLOCKER";
    case ND_EXT_APX_EVEX_KMOV: return "APX-EVEX-KMOV";
    case ND_EXT_APX_EVEX_PP2: return "APX-EVEX-PP2";
    case ND_EXT_APX_EVEX_SHA: return "APX-EVEX-SHA";
    case ND_EXT_APX_EVEX_RAOINT: return "APX-EVEX-RAO-INT";
    case ND_EXT_APX_EVEX_USER_MSR: return "APX-EVEX-USER-MSR";

    default: return "None";
    }
}